

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah_spatial.cpp
# Opt level: O3

void __thiscall
embree::avx::
BVHNBuilderFastSpatialSAH<8,_embree::QuadMesh,_embree::QuadMv<4>,_embree::avx::QuadSplitterFactory>
::build(BVHNBuilderFastSpatialSAH<8,_embree::QuadMesh,_embree::QuadMv<4>,_embree::avx::QuadSplitterFactory>
        *this)

{
  mvector<PrimRef> *prims;
  undefined8 *puVar1;
  undefined8 *puVar2;
  bool bVar3;
  uint uVar4;
  pointer ppTVar5;
  Device *pDVar6;
  Block *pBVar7;
  PrimRef *pPVar8;
  MemoryMonitorInterface *pMVar9;
  Geometry *pGVar10;
  Scene *pSVar11;
  double dVar12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  long lVar17;
  QuadMesh *pQVar18;
  long *plVar19;
  ulong uVar20;
  PrimRef *pPVar21;
  size_t sVar22;
  NodeRef root;
  ulong uVar23;
  long *plVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  ulong uVar27;
  EVP_PKEY_CTX *ctx;
  __pointer_type pBVar28;
  pointer ppTVar29;
  BVH **ppBVar30;
  BVH *pBVar31;
  size_t sVar32;
  PrimInfo pinfo;
  string __str;
  BuildProgressMonitor *in_stack_fffffffffffffe58;
  BuildProgressMonitor *in_stack_fffffffffffffe60;
  byte local_161;
  Scene **local_158;
  Geometry *local_150;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  size_t local_108;
  size_t sStack_100;
  BVH **local_f0;
  size_t *local_e8;
  double local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_88;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aStack_68;
  size_t local_58;
  size_t sStack_50;
  undefined **local_40;
  Scene *local_38;
  
  pQVar18 = this->mesh;
  if (pQVar18 == (QuadMesh *)0x0) {
LAB_012f9ec6:
    sVar22 = (this->scene->world).numQuads;
    this->numPreviousPrimitives = (uint)sVar22;
    if (sVar22 == 0) goto LAB_012f9f30;
    pSVar11 = this->scene;
    sVar32 = (pSVar11->geometries).size_active;
    if (sVar32 == 0) {
      local_150 = (Geometry *)0x0;
    }
    else {
      local_150 = (Geometry *)0x0;
      uVar20 = 0;
      do {
        pGVar10 = (pSVar11->geometries).items[uVar20].ptr;
        if ((((pGVar10 != (Geometry *)0x0) && (((uint)pGVar10->field_8 & 0x2000ff) == 0x200015)) &&
            (pGVar10->numTimeSteps == 1)) && ((uint)local_150 <= (uint)uVar20)) {
          local_150 = (Geometry *)(uVar20 & 0xffffffff);
        }
        uVar20 = uVar20 + 1;
      } while (sVar32 != uVar20);
    }
    local_161 = 0x7ffffff < (uint)local_150 |
                *(byte *)(*(long *)&(pSVar11->super_AccelN).field_0x188 + 0x464);
    pBVar31 = this->bvh;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct((ulong)local_b8,'\x01');
    *local_b8[0] = 0x38;
    plVar19 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x1fb0eed);
    local_d8 = &local_c8;
    plVar24 = plVar19 + 2;
    if ((long *)*plVar19 == plVar24) {
      local_c8 = *plVar24;
      lStack_c0 = plVar19[3];
    }
    else {
      local_c8 = *plVar24;
      local_d8 = (long *)*plVar19;
    }
    local_d0 = plVar19[1];
    *plVar19 = (long)plVar24;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    plVar19 = (long *)std::__cxx11::string::append((char *)&local_d8);
    local_148._0_8_ = &aStack_138;
    paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar19 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar19 == paVar25) {
      aStack_138._M_allocated_capacity = paVar25->_M_allocated_capacity;
      aStack_138._8_8_ = plVar19[3];
    }
    else {
      aStack_138._M_allocated_capacity = paVar25->_M_allocated_capacity;
      local_148._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar19;
    }
    local_148._8_8_ = plVar19[1];
    *plVar19 = (long)paVar25;
    plVar19[1] = 0;
    *(undefined1 *)(plVar19 + 2) = 0;
    bVar3 = true;
  }
  else {
    if ((pQVar18->super_Geometry).numPrimitives != this->numPreviousPrimitives) {
      pBVar31 = this->bvh;
      FastAllocator::internal_fix_used_blocks(&pBVar31->alloc);
      ppTVar29 = (pBVar31->alloc).thread_local_allocators.
                 super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar5 = (pBVar31->alloc).thread_local_allocators.
                super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (ppTVar29 != ppTVar5) {
        do {
          FastAllocator::ThreadLocal2::unbind(*ppTVar29,&pBVar31->alloc);
          ppTVar29 = ppTVar29 + 1;
        } while (ppTVar29 != ppTVar5);
        ppTVar29 = (pBVar31->alloc).thread_local_allocators.
                   super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if ((pBVar31->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppTVar29) {
          (pBVar31->alloc).thread_local_allocators.
          super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppTVar29;
        }
      }
      LOCK();
      (pBVar31->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar31->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      LOCK();
      (pBVar31->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
      UNLOCK();
      if ((pBVar31->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar31->alloc).device;
        bVar3 = (pBVar31->alloc).useUSM;
        pBVar28 = (pBVar31->alloc).usedBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar28->next;
          FastAllocator::Block::clear_block(pBVar28,pDVar6,bVar3);
          pBVar28 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar31->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      if ((pBVar31->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
        pDVar6 = (pBVar31->alloc).device;
        bVar3 = (pBVar31->alloc).useUSM;
        pBVar28 = (pBVar31->alloc).freeBlocks._M_b._M_p;
        do {
          pBVar7 = pBVar28->next;
          FastAllocator::Block::clear_block(pBVar28,pDVar6,bVar3);
          pBVar28 = pBVar7;
        } while (pBVar7 != (Block *)0x0);
      }
      LOCK();
      (pBVar31->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar17 = -8;
      do {
        LOCK();
        (pBVar31->alloc).threadBlocks[lVar17]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        LOCK();
        (pBVar31->alloc).threadBlocks[lVar17 + 8]._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0);
      sVar22 = (pBVar31->alloc).primrefarray.size_alloced;
      pPVar8 = (pBVar31->alloc).primrefarray.items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar22 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar22 << 5,(pBVar31->alloc).primrefarray.alloc.hugepages);
        }
      }
      if (sVar22 != 0) {
        pMVar9 = (pBVar31->alloc).primrefarray.alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar22 * -0x20,1);
      }
      (pBVar31->alloc).primrefarray.size_active = 0;
      (pBVar31->alloc).primrefarray.size_alloced = 0;
      (pBVar31->alloc).primrefarray.items = (PrimRef *)0x0;
      pQVar18 = this->mesh;
      if (pQVar18 == (QuadMesh *)0x0) goto LAB_012f9ec6;
    }
    uVar4 = (pQVar18->super_Geometry).numPrimitives;
    sVar22 = (size_t)uVar4;
    this->numPreviousPrimitives = uVar4;
    if (sVar22 == 0) {
LAB_012f9f30:
      sVar22 = (this->prims0).size_alloced;
      pPVar8 = (this->prims0).items;
      if (pPVar8 != (PrimRef *)0x0) {
        if (sVar22 << 5 < 0x1c00000) {
          alignedFree(pPVar8);
        }
        else {
          os_free(pPVar8,sVar22 << 5,(this->prims0).alloc.hugepages);
        }
      }
      if (sVar22 != 0) {
        pMVar9 = (this->prims0).alloc.device;
        (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar22 * -0x20,1);
      }
      (this->prims0).size_active = 0;
      (this->prims0).size_alloced = 0;
      (this->prims0).items = (PrimRef *)0x0;
      (*(this->bvh->super_AccelData).super_RefCount._vptr_RefCount[5])();
      return;
    }
    local_150 = (Geometry *)(ulong)this->geomID_;
    pBVar31 = this->bvh;
    local_161 = 0x7ffffff < this->geomID_ |
                *(byte *)(*(long *)&(this->scene->super_AccelN).field_0x188 + 0x464);
    local_148._0_8_ = &aStack_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"");
    bVar3 = false;
  }
  local_158 = &this->scene;
  ppBVar30 = &this->bvh;
  local_e0 = BVHN<8>::preBuild(pBVar31,(string *)&local_148.field_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._0_8_ != &aStack_138) {
    operator_delete((void *)local_148._0_8_);
  }
  if (bVar3) {
    if (local_d8 != &local_c8) {
      operator_delete(local_d8);
    }
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0]);
    }
  }
  fVar13 = (float)sVar22 * this->splitFactor;
  uVar20 = (ulong)fVar13;
  uVar20 = (long)(fVar13 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20;
  if (uVar20 < sVar22) {
    uVar20 = sVar22;
  }
  uVar23 = (this->prims0).size_alloced;
  uVar27 = uVar23;
  if ((uVar23 < uVar20) && (uVar27 = uVar20, uVar26 = uVar23, uVar23 != 0)) {
    do {
      uVar27 = uVar26 * 2 + (ulong)(uVar26 * 2 == 0);
      uVar26 = uVar27;
    } while (uVar27 < uVar20);
  }
  local_e8 = &(this->prims0).size_active;
  if (uVar20 < (this->prims0).size_active) {
    *local_e8 = uVar20;
  }
  prims = &this->prims0;
  if (uVar23 == uVar27) {
    *local_e8 = uVar20;
    goto LAB_012fa2c7;
  }
  pPVar8 = (this->prims0).items;
  local_f0 = ppBVar30;
  if (uVar27 == 0) {
    sVar32 = 0;
LAB_012fa222:
    pPVar21 = (PrimRef *)alignedMalloc(sVar32,0x20);
  }
  else {
    pMVar9 = (prims->alloc).device;
    sVar32 = uVar27 << 5;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar32,0);
    if (sVar32 < 0x1c00000) goto LAB_012fa222;
    pPVar21 = (PrimRef *)os_malloc(sVar32,&(this->prims0).alloc.hugepages);
  }
  (this->prims0).items = pPVar21;
  if ((this->prims0).size_active == 0) {
    sVar32 = (this->prims0).size_alloced;
    if (pPVar8 != (PrimRef *)0x0) goto LAB_012fa26a;
  }
  else {
    lVar17 = 0;
    uVar23 = 0;
    do {
      puVar2 = (undefined8 *)((long)&(pPVar8->lower).field_0 + lVar17);
      uVar14 = puVar2[1];
      uVar15 = puVar2[2];
      uVar16 = puVar2[3];
      puVar1 = (undefined8 *)((long)&(((this->prims0).items)->lower).field_0 + lVar17);
      *puVar1 = *puVar2;
      puVar1[1] = uVar14;
      puVar1[2] = uVar15;
      puVar1[3] = uVar16;
      uVar23 = uVar23 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar23 < (this->prims0).size_active);
    sVar32 = (this->prims0).size_alloced;
LAB_012fa26a:
    if (sVar32 << 5 < 0x1c00000) {
      alignedFree(pPVar8);
    }
    else {
      os_free(pPVar8,sVar32 << 5,(this->prims0).alloc.hugepages);
    }
  }
  if (sVar32 != 0) {
    pMVar9 = (prims->alloc).device;
    (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,sVar32 * -0x20,1);
  }
  (this->prims0).size_active = uVar20;
  (this->prims0).size_alloced = uVar27;
  ppBVar30 = local_f0;
LAB_012fa2c7:
  if (this->mesh != (QuadMesh *)0x0) {
    ((*ppBVar30)->alloc).atype = EMBREE_OS_MALLOC;
  }
  if (local_161 == 0) {
    if (this->mesh == (QuadMesh *)0x0) {
      avx::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,*local_158,MTY_QUAD_MESH,false,uVar20,prims,
                 &((*ppBVar30)->scene->progressInterface).super_BuildProgressMonitor);
    }
    else {
      avx::createPrimRefArray
                ((PrimInfo *)&local_98.field_1,&this->mesh->super_Geometry,this->geomID_,uVar20,
                 prims,&(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    }
    local_148._0_8_ = local_98._0_8_;
    local_148._8_8_ = local_98._8_8_;
    aStack_138._M_allocated_capacity = aStack_88._0_8_;
    aStack_138._8_8_ = aStack_88._8_8_;
    local_128 = local_78._0_8_;
    uStack_120 = local_78._8_8_;
    uStack_118 = aStack_68._0_8_;
    uStack_110 = aStack_68._8_8_;
    local_108 = local_58;
    sStack_100 = sStack_50;
    pSVar11 = this->scene;
    dVar12 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 224.0;
    uVar23 = (ulong)dVar12;
    sVar22 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar23 >> 0x3f | uVar23) +
             (sStack_50 - local_58 & 0xffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar22);
    sVar22 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,8,0x400,sStack_100 - local_108,sVar22);
    (this->settings).singleThreadThreshold = sVar22;
    (this->settings).branchingFactor = 8;
    (this->settings).maxDepth = 0x28;
    local_98._0_8_ = this->bvh;
    local_40 = &PTR_operator___02185a30;
    local_38 = (((BVH *)local_98._0_8_)->scene->progressInterface).scene;
    root.ptr = (size_t)BVHBuilderBinnedFastSpatialSAH::
                       build<embree::NodeRefPtr<8>,embree::BVHN<8>::CreateAlloc,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Create2,embree::AABBNode_t<embree::NodeRefPtr<8>,8>::Set2,embree::avx::CreateLeafSpatial<8,embree::QuadMv<4>>,embree::avx::QuadSplitterFactory,embree::Scene::BuildProgressMonitorInterface>
                                 (&((BVH *)local_98._0_8_)->alloc,&local_98,pSVar11,&local_40,
                                  (this->prims0).items,uVar20,&local_148,&this->settings);
  }
  else {
    if (this->mesh == (QuadMesh *)0x0) {
      createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(avx *)*local_158,(Scene *)0x200000,~MTY_ALL,
                 SUB81(sVar22,0),(size_t)prims,
                 (mvector<PrimRef> *)&(*ppBVar30)->scene->progressInterface,
                 in_stack_fffffffffffffe60);
    }
    else {
      createPrimRefArray_presplit<embree::QuadMesh,embree::avx::QuadSplitterFactory>
                ((PrimInfo *)&local_98.field_1,(avx *)this->mesh,local_150,(uint)sVar22,
                 (size_t)prims,(mvector<PrimRef> *)&(*ppBVar30)->scene->progressInterface,
                 in_stack_fffffffffffffe58);
    }
    local_148._0_8_ = local_98._0_8_;
    local_148._8_8_ = local_98._8_8_;
    aStack_138._M_allocated_capacity = aStack_88._0_8_;
    aStack_138._8_8_ = aStack_88._8_8_;
    local_128 = local_78._0_8_;
    uStack_120 = local_78._8_8_;
    uStack_118 = aStack_68._0_8_;
    uStack_110 = aStack_68._8_8_;
    local_108 = local_58;
    sStack_100 = sStack_50;
    dVar12 = (double)((sStack_50 - local_58) + 3 >> 2) * 1.2 * 224.0;
    uVar20 = (ulong)dVar12;
    sVar22 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar20 >> 0x3f | uVar20) +
             (sStack_50 - local_58 & 0xffffffffffffff) * 8;
    FastAllocator::init_estimate(&this->bvh->alloc,sVar22);
    sVar22 = FastAllocator::fixSingleThreadThreshold
                       (&this->bvh->alloc,8,0x400,sStack_100 - local_108,sVar22);
    (this->settings).singleThreadThreshold = sVar22;
    (this->settings).branchingFactor = 8;
    (this->settings).maxDepth = 0x28;
    local_98._8_8_ = this->bvh;
    local_98._0_8_ = &PTR_createLeaf_02197fa8;
    root.ptr = (size_t)BVHNBuilderVirtual<8>::BVHNBuilderV::build
                                 ((BVHNBuilderV *)&local_98.field_1,&((BVH *)local_98._8_8_)->alloc,
                                  &(((BVH *)local_98._8_8_)->scene->progressInterface).
                                   super_BuildProgressMonitor,(this->prims0).items,
                                  (PrimInfo *)&local_148.field_1,this->settings);
  }
  local_98._0_8_ = local_148._0_8_;
  local_98._8_8_ = local_148._8_8_;
  aStack_88._0_8_ = aStack_138._M_allocated_capacity;
  aStack_88._8_8_ = aStack_138._8_8_;
  local_78._0_8_ = local_148._0_8_;
  local_78._8_8_ = local_148._8_8_;
  aStack_68._0_8_ = aStack_138._M_allocated_capacity;
  aStack_68._8_8_ = aStack_138._8_8_;
  BVHN<8>::set(*ppBVar30,root,(LBBox3fa *)&local_98.field_1,sStack_100 - local_108);
  fVar13 = (float)(sStack_100 - local_108) * 0.005;
  uVar20 = (ulong)fVar13;
  ctx = (EVP_PKEY_CTX *)((long)(fVar13 - 9.223372e+18) & (long)uVar20 >> 0x3f | uVar20);
  BVHN<8>::layoutLargeNodes(*ppBVar30,(size_t)ctx);
  if ((*local_158 != (Scene *)0x0) &&
     (((*local_158)->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE)) {
    sVar22 = (this->prims0).size_alloced;
    pPVar8 = (this->prims0).items;
    if (pPVar8 != (PrimRef *)0x0) {
      ctx = (EVP_PKEY_CTX *)(sVar22 << 5);
      if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
        alignedFree(pPVar8);
      }
      else {
        os_free(pPVar8,(size_t)ctx,(this->prims0).alloc.hugepages);
      }
    }
    if (sVar22 != 0) {
      pMVar9 = (prims->alloc).device;
      ctx = (EVP_PKEY_CTX *)(sVar22 * -0x20);
      (**pMVar9->_vptr_MemoryMonitorInterface)(pMVar9,ctx,1);
    }
    *local_e8 = 0;
    local_e8[1] = 0;
    local_e8[2] = 0;
  }
  BVHN<8>::cleanup(*ppBVar30,ctx);
  BVHN<8>::postBuild(*ppBVar30,local_e0);
  return;
}

Assistant:

void build()
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh && mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
        }

	/* skip build for empty scene */
        const size_t numOriginalPrimitives = mesh ? mesh->size() : scene->getNumPrimitives(Mesh::geom_type,false);
        numPreviousPrimitives = numOriginalPrimitives;
        if (numOriginalPrimitives == 0) {
          prims0.clear();
          bvh->clear();
          return;
        }

        const unsigned int maxGeomID = mesh ? geomID_ : scene->getMaxGeomID<Mesh,false>();
        const bool usePreSplits = scene->device->useSpatialPreSplits || (maxGeomID >= ((unsigned int)1 << (32-RESERVED_NUM_SPATIAL_SPLITS_GEOMID_BITS)));
        double t0 = bvh->preBuild(mesh ? "" : TOSTRING(isa) "::BVH" + toString(N) + (usePreSplits ? "BuilderFastSpatialPresplitSAH" : "BuilderFastSpatialSAH"));

        /* create primref array */
        const size_t numSplitPrimitives = max(numOriginalPrimitives,size_t(splitFactor*numOriginalPrimitives));
        prims0.resize(numSplitPrimitives);

        /* enable os_malloc for two level build */
        if (mesh)
          bvh->alloc.setOSallocation(true);
	
	NodeRef root(0);
	PrimInfo pinfo;
	

        if (likely(usePreSplits))
	  {		     
            /* spatial presplit SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray_presplit<Mesh,Splitter>(mesh,maxGeomID,numOriginalPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray_presplit<Mesh,Splitter>(scene,Mesh::geom_type,false,numOriginalPrimitives,prims0,bvh->scene->progressInterface);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHNBuilderVirtual<N>::build(&bvh->alloc,CreateLeafSpatial<N,Primitive>(bvh),bvh->scene->progressInterface,prims0.data(),pinfo,settings);
	  }
	else
	  {
            /* standard spatial split SAH BVH builder */
	    pinfo = mesh ?
	      createPrimRefArray(mesh,geomID_,numSplitPrimitives,prims0,bvh->scene->progressInterface) :
	      createPrimRefArray(scene,Mesh::geom_type,false,numSplitPrimitives,prims0,bvh->scene->progressInterface);
	
	    Splitter splitter(scene);

	    const size_t node_bytes = pinfo.size()*sizeof(typename BVH::AABBNode)/(4*N);
	    const size_t leaf_bytes = size_t(1.2*Primitive::blocks(pinfo.size())*sizeof(Primitive));
	    bvh->alloc.init_estimate(node_bytes+leaf_bytes);
	    settings.singleThreadThreshold = bvh->alloc.fixSingleThreadThreshold(N,DEFAULT_SINGLE_THREAD_THRESHOLD,pinfo.size(),node_bytes+leaf_bytes);

	    settings.branchingFactor = N;
	    settings.maxDepth = BVH::maxBuildDepthLeaf;

	    /* call BVH builder */
	    root = BVHBuilderBinnedFastSpatialSAH::build<NodeRef>(
								  typename BVH::CreateAlloc(bvh),
								  typename BVH::AABBNode::Create2(),
								  typename BVH::AABBNode::Set2(),
								  CreateLeafSpatial<N,Primitive>(bvh),
								  splitter,
								  bvh->scene->progressInterface,
								  prims0.data(),
								  numSplitPrimitives,
								  pinfo,settings);

	    /* ==================== */
	  }

        bvh->set(root,LBBox3fa(pinfo.geomBounds),pinfo.size());
        bvh->layoutLargeNodes(size_t(pinfo.size()*0.005f));

	/* clear temporary data for static geometry */
	if (scene && scene->isStaticAccel()) {
          prims0.clear();
        }
	bvh->cleanup();
        bvh->postBuild(t0);
      }